

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> * __thiscall
chrono::ChArchiveExplorer::FetchValues<std::vector<myEmployee,std::allocator<myEmployee>>>
          (ChArchiveExplorer *this,vector<myEmployee,_std::allocator<myEmployee>_> *root,
          string *value_name)

{
  char in_R9B;
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> local_38;
  string *local_20;
  string *value_name_local;
  vector<myEmployee,_std::allocator<myEmployee>_> *root_local;
  ChArchiveExplorer *this_local;
  
  local_20 = value_name;
  value_name_local = (string *)root;
  root_local = (vector<myEmployee,_std::allocator<myEmployee>_> *)this;
  PrepareSearch(this,value_name);
  this->find_all = true;
  make_ChNameValue<std::vector<myEmployee,std::allocator<myEmployee>>>
            (&local_38,(chrono *)"root",(char *)value_name_local,
             (vector<myEmployee,_std::allocator<myEmployee>_> *)0x19db55,(char *)0x0,in_R9B);
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_38);
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::~ChNameValue(&local_38);
  return &this->results;
}

Assistant:

std::vector<ChValue*>& FetchValues( T& root, const std::string& value_name) {
          this->PrepareSearch(value_name);
          this->find_all = true;
          this->operator<<( CHNVP(root,"") ); // SCAN! 
          return this->results;
      }